

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::GPUShaderFP64Test7::iterate(GPUShaderFP64Test7 *this)

{
  pointer *this_00;
  pointer *this_01;
  _variable_type output_variable_type;
  bool bVar1;
  uint uVar2;
  long lVar3;
  NotSupportedError *pNVar4;
  uint uVar5;
  char *pcVar6;
  GPUShaderFP64Test7 *this_02;
  int iVar7;
  _variable new_variable;
  _variables variables_to_test;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&variables_to_test,"GL_ARB_gpu_shader_fp64 is not supported.",
               (allocator<char> *)&new_variable);
    tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)&variables_to_test);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pcVar6 = "GL_ARB_vertex_attrib_64bit";
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_vertex_attrib_64bit")
  ;
  if (!bVar1) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&variables_to_test,"GL_ARB_vertex_attrib_64bit is not supported.",
               (allocator<char> *)&new_variable);
    tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)&variables_to_test);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  this_00 = &variables_to_test.
             super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (lVar3 = 0; lVar3 != 0xd; lVar3 = lVar3 + 1) {
    output_variable_type = (&DAT_01694730)[lVar3];
    for (uVar5 = 1; uVar5 != 3; uVar5 = uVar5 + 1) {
      uVar2 = this->m_fs_id;
      getCodeOfFragmentShaderWithDoublePrecisionOutput_abi_cxx11_
                ((string *)&variables_to_test,(GPUShaderFP64Test7 *)pcVar6,output_variable_type,
                 uVar5);
      this_02 = (GPUShaderFP64Test7 *)(ulong)uVar2;
      bVar1 = compileShader(this,uVar2,(string *)&variables_to_test);
      std::__cxx11::string::~string((string *)&variables_to_test);
      if (bVar1) {
        variables_to_test.
        super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_01 = &variables_to_test.
                   super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
        std::operator<<((ostream *)this_01,
                        "A fragment shader with double-precision output variable compiled successfully."
                       );
        this_02 = (GPUShaderFP64Test7 *)&tcu::TestLog::EndMessage;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&variables_to_test,(EndMessageToken *)&tcu::TestLog::EndMessage
                  );
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)
                   &variables_to_test.
                    super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        this->m_has_test_passed = false;
      }
      uVar2 = this->m_fs_id;
      getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput_abi_cxx11_
                ((string *)&variables_to_test,this_02,output_variable_type,uVar5);
      pcVar6 = (char *)(ulong)uVar2;
      bVar1 = compileShader(this,uVar2,(string *)&variables_to_test);
      std::__cxx11::string::~string((string *)&variables_to_test);
      if (bVar1) {
        variables_to_test.
        super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,
                        "A fragment shader with double-precision input variables lacking flat layout qualifier compiled successfully."
                       );
        pcVar6 = &tcu::TestLog::EndMessage;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&variables_to_test,(EndMessageToken *)&tcu::TestLog::EndMessage
                  );
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        this->m_has_test_passed = false;
      }
    }
  }
  variables_to_test.
  super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  variables_to_test.
  super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  variables_to_test.
  super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = 0;
  do {
    if (uVar5 == 0x1a) {
      pcVar6 = "Fail";
      if (this->m_has_test_passed != QP_TEST_RESULT_PASS) {
        pcVar6 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 this->m_has_test_passed ^ QP_TEST_RESULT_FAIL,pcVar6);
      std::
      _Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
      ::~_Vector_base(&variables_to_test.
                       super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                     );
      return STOP;
    }
    iVar7 = 0;
    while( true ) {
      if ((this->m_n_max_components_per_stage <= iVar7) || (uVar5 == 0x1a)) goto LAB_009efca3;
      new_variable.array_size = (uVar5 & 1) + 1;
      new_variable.type = (&DAT_01694730)[uVar5 >> 1];
      uVar2 = Utils::getNumberOfLocationsUsedByDoublePrecisionVariableType(new_variable.type);
      iVar7 = iVar7 + uVar2 * new_variable.array_size * 8;
      if (this->m_n_max_components_per_stage < iVar7) break;
      std::
      vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
      ::push_back(&variables_to_test,&new_variable);
      uVar5 = uVar5 + 1;
    }
    uVar5 = uVar5 + (this->m_n_max_components_per_stage < (int)(uVar2 * new_variable.array_size * 8)
                    );
LAB_009efca3:
    if (variables_to_test.
        super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        variables_to_test.
        super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar1 = executeFunctionalTest(this,&variables_to_test);
      this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar1);
      if (variables_to_test.
          super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          variables_to_test.
          super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        variables_to_test.
        super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             variables_to_test.
             super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test7::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_vertex_attrib_64bit"))
	{
		throw tcu::NotSupportedError("GL_ARB_vertex_attrib_64bit is not supported.");
	}

	/* Initialize GL objects required to run the test */
	initTest();

	/* Check the negative cases first */
	const Utils::_variable_type double_variable_types[] = {
		Utils::VARIABLE_TYPE_DOUBLE,  Utils::VARIABLE_TYPE_DVEC2, Utils::VARIABLE_TYPE_DVEC3,
		Utils::VARIABLE_TYPE_DVEC4,   Utils::VARIABLE_TYPE_DMAT2, Utils::VARIABLE_TYPE_DMAT2X3,
		Utils::VARIABLE_TYPE_DMAT2X4, Utils::VARIABLE_TYPE_DMAT3, Utils::VARIABLE_TYPE_DMAT3X2,
		Utils::VARIABLE_TYPE_DMAT3X4, Utils::VARIABLE_TYPE_DMAT4, Utils::VARIABLE_TYPE_DMAT4X2,
		Utils::VARIABLE_TYPE_DMAT4X3,
	};
	const unsigned int n_double_variable_types = sizeof(double_variable_types) / sizeof(double_variable_types[0]);

	for (unsigned int n_double_variable_type = 0; n_double_variable_type < n_double_variable_types;
		 ++n_double_variable_type)
	{
		for (unsigned int array_size = 1; array_size < 3; ++array_size)
		{
			Utils::_variable_type variable_type = double_variable_types[n_double_variable_type];

			if (compileShader(m_fs_id, getCodeOfFragmentShaderWithDoublePrecisionOutput(variable_type, array_size)))
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "A fragment shader with double-precision output variable compiled successfully."
								   << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
			}

			if (compileShader(m_fs_id,
							  getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput(variable_type, array_size)))
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "A fragment shader with double-precision input variables lacking flat layout qualifier"
					   " compiled successfully."
					<< tcu::TestLog::EndMessage;

				m_has_test_passed = false;
			}
		}
	} /* for (all variable types) */

	/* Execute functional test. Split the run into as many iterations as necessary
	 * so that we do not exceed GL implementation's capabilities. */
	unsigned int n_tested_variables = 0;
	_variables   variables_to_test;

	while (n_tested_variables != n_double_variable_types * 2 /* arrayed & non-arrayed */)
	{
		glw::GLint total_n_used_components = 0;

		/* Use as many variables as possible for the iterations. Do not exceed maximum amount
		 * of varying components that can be used for all shadr stages.
		 */
		while (total_n_used_components < m_n_max_components_per_stage &&
			   n_tested_variables != n_double_variable_types * 2 /* arrayed & non-arrayed */)
		{
			_variable	new_variable;
			unsigned int n_type_components = 0;
			glw::GLint   n_used_components = 0;

			new_variable.array_size =
				((n_tested_variables % 2) == 0) ? 1 /* non-arrayed variable */ : 2; /* arrayed variable */
			new_variable.type = double_variable_types[n_tested_variables / 2];

			/* Double-precision varyings can use twice as many components as single-precision FPs */
			n_type_components = 4 /* components per location */ *
								Utils::getNumberOfLocationsUsedByDoublePrecisionVariableType(new_variable.type);
			n_used_components = n_type_components * new_variable.array_size * 2;

			/* Do we have enough space? */
			if (total_n_used_components + n_used_components > m_n_max_components_per_stage)
			{
				if (n_used_components > m_n_max_components_per_stage)
				{ //if the number of components for this variable is larger than the max_components_per_stage, then skip it.
					n_tested_variables++;
				}
				break;
			}

			/* We can safely test the type in current iteration */
			total_n_used_components += n_used_components;
			n_tested_variables++;

			variables_to_test.push_back(new_variable);
		}

		if (variables_to_test.size() > 0)
		{
			m_has_test_passed &= executeFunctionalTest(variables_to_test);

			variables_to_test.clear();
		}
	}

	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}